

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::~IfcRelContainedInSpatialStructure
          (IfcRelContainedInSpatialStructure *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
            (long)pp_Var1[-3]) = vtt[0x12];
  *(void **)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x88 = vtt[0x13]
  ;
  *(void **)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x98 = vtt[0x14]
  ;
  *(void **)&(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8 = vtt[0x15];
  std::
  _Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_>_>
  ::~_Vector_base((_Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProduct>_>_>
                   *)&(this->super_IfcRelConnects).field_0xb8);
  IfcRoot::~IfcRoot((IfcRoot *)this,vtt + 3);
  return;
}

Assistant:

IfcRelContainedInSpatialStructure() : Object("IfcRelContainedInSpatialStructure") {}